

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

MCU * readMCU(MCU *__return_storage_ptr__,FILE *f)

{
  int iVar1;
  acCode aVar2;
  int local_30;
  int local_2c;
  int j_1;
  int j;
  acCode ac;
  uint count;
  int w;
  int h;
  int i;
  FILE *f_local;
  
  memset(__return_storage_ptr__,0,0x2000);
  w = 1;
  do {
    if (3 < w) {
      return __return_storage_ptr__;
    }
    for (count = 0; (int)count < (int)(uint)subVector[w].height; count = count + 1) {
      for (ac.value = 0; ac.value < (int)(uint)subVector[w].width; ac.value = ac.value + 1) {
        iVar1 = readDC(f,(uchar)(w / 2));
        readMCU::dc[w] = iVar1 + readMCU::dc[w];
        __return_storage_ptr__->mcu[w][(int)count][ac.value][0][0] = (double)readMCU::dc[w];
        ac.len = '\x01';
        ac.zeros = '\0';
        ac._2_2_ = 0;
        while ((uint)ac._0_4_ < 0x40) {
          aVar2 = readAC(f,(uchar)(w / 2));
          j_1._0_1_ = aVar2.len;
          j_1._1_1_ = aVar2.zeros;
          if (((uchar)j_1 == '\0') && (j_1._1_1_ == 0x10)) {
            for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
              __return_storage_ptr__->mcu[w][(int)count][ac.value][(uint)ac._0_4_ >> 3]
              [ac._0_4_ & 7] = 0.0;
              ac._0_4_ = ac._0_4_ + 1;
            }
          }
          else {
            if ((uchar)j_1 == '\0') break;
            for (local_30 = 0; local_30 < (int)(uint)j_1._1_1_; local_30 = local_30 + 1) {
              __return_storage_ptr__->mcu[w][(int)count][ac.value][(uint)ac._0_4_ >> 3]
              [ac._0_4_ & 7] = 0.0;
              ac._0_4_ = ac._0_4_ + 1;
            }
            j = aVar2.value;
            __return_storage_ptr__->mcu[w][(int)count][ac.value][(uint)ac._0_4_ >> 3][ac._0_4_ & 7]
                 = (double)j;
            ac._0_4_ = ac._0_4_ + 1;
          }
        }
        for (; (uint)ac._0_4_ < 0x40; ac._0_4_ = ac._0_4_ + 1) {
          __return_storage_ptr__->mcu[w][(int)count][ac.value][(uint)ac._0_4_ >> 3][ac._0_4_ & 7] =
               0.0;
        }
      }
    }
    w = w + 1;
  } while( true );
}

Assistant:

MCU readMCU(FILE *f) {
    static int dc[4] = {0, 0, 0, 0};
    auto mcu = MCU();
    for (int i = 1; i <= 3; i++) {
        for (int h = 0; h < subVector[i].height; h++) {
            for (int w = 0; w < subVector[i].width; w++) {
                dc[i] = readDC(f, i/2) + dc[i];
                mcu.mcu[i][h][w][0][0] = dc[i];
                unsigned int count = 1;
                while (count < 64) {
                    acCode ac = readAC(f, i/2);
                    if (ac.len == 0 && ac.zeros == 16) {
                        for (int j = 0; j < ac.zeros; j++) {
                            mcu.mcu[i][h][w][count/8][count%8] = 0;
                            count++;
                        }
                    } else if (ac.len == 0) {
                        break;
                    } else {
                        for (int j = 0; j < ac.zeros; j++) {
                            mcu.mcu[i][h][w][count/8][count%8] = 0;
                            count++;
                        }
                        mcu.mcu[i][h][w][count/8][count%8] = ac.value;
                        count++;
                    }
                }
                while (count < 64) {
                    mcu.mcu[i][h][w][count/8][count%8] = 0;
                    count++;
                }
            }
        }
    }
    return mcu;
}